

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O0

ssize_t __thiscall
capnp::LocalRequest::send(LocalRequest *this,int __fd,void *__buf,size_t __n,int __flags)

{
  char *pcVar1;
  ushort uVar2;
  MallocMessageBuilder *pMVar3;
  Own<capnp::MallocMessageBuilder> *params;
  ClientHook *pCVar4;
  Own<kj::PromiseFulfiller<void>_> *params_2;
  RefOrVoid<capnp::LocalCallContext> pLVar5;
  Promise<capnp::Response<capnp::AnyPointer>_> *promise_00;
  Own<capnp::PipelineHook> *hook;
  Type *func;
  undefined4 in_register_00000034;
  Exception *pEVar6;
  Pipeline local_180;
  undefined1 local_151;
  CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:215:9),_kj::Own<capnp::LocalCallContext>_>
  local_150;
  undefined1 local_138 [24];
  PromiseForResult<kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:215:9),_kj::Own<capnp::LocalCallContext>_>,_void>
  promise;
  Own<capnp::LocalCallContext> local_110;
  Own<capnp::LocalCallContext> local_100;
  Promise<void> local_f0;
  Promise<void> local_e0;
  undefined1 local_d0 [8];
  ForkedPromise<void> forked;
  Own<capnp::CallContextHook> local_b0;
  undefined1 local_a0 [8];
  VoidPromiseAndPipeline promiseAndPipeline;
  undefined1 local_70 [8];
  Own<capnp::LocalCallContext> context;
  PromiseFulfillerPair<void> cancelPaf;
  uint16_t methodId;
  uint64_t interfaceId;
  Fault local_20;
  Fault f;
  LocalRequest *this_local;
  
  pEVar6 = (Exception *)CONCAT44(in_register_00000034,__fd);
  f.exception = pEVar6;
  pMVar3 = kj::Own<capnp::MallocMessageBuilder>::get
                     ((Own<capnp::MallocMessageBuilder> *)&(pEVar6->ownFile).content.size_);
  if (pMVar3 != (MallocMessageBuilder *)0x0) {
    pcVar1 = pEVar6->file;
    cancelPaf.fulfiller.ptr._6_2_ = (ushort)pEVar6->line;
    kj::newPromiseAndFulfiller<void>();
    params = kj::mv<kj::Own<capnp::MallocMessageBuilder>>
                       ((Own<capnp::MallocMessageBuilder> *)&(pEVar6->ownFile).content.size_);
    pCVar4 = kj::Own<capnp::ClientHook>::operator->((Own<capnp::ClientHook> *)&pEVar6->description);
    (*pCVar4->_vptr_ClientHook[4])(&promiseAndPipeline.pipeline.ptr);
    params_2 = kj::mv<kj::Own<kj::PromiseFulfiller<void>>>
                         ((Own<kj::PromiseFulfiller<void>_> *)
                          &cancelPaf.promise.super_PromiseBase.node.ptr);
    kj::
    refcounted<capnp::LocalCallContext,kj::Own<capnp::MallocMessageBuilder>,kj::Own<capnp::ClientHook>,kj::Own<kj::PromiseFulfiller<void>>>
              ((kj *)local_70,params,(Own<capnp::ClientHook> *)&promiseAndPipeline.pipeline.ptr,
               params_2);
    kj::Own<capnp::ClientHook>::~Own((Own<capnp::ClientHook> *)&promiseAndPipeline.pipeline.ptr);
    pCVar4 = kj::Own<capnp::ClientHook>::operator->((Own<capnp::ClientHook> *)&pEVar6->description);
    uVar2 = cancelPaf.fulfiller.ptr._6_2_;
    pLVar5 = kj::Own<capnp::LocalCallContext>::operator*((Own<capnp::LocalCallContext> *)local_70);
    kj::addRef<capnp::LocalCallContext>((kj *)&forked.hub.ptr,pLVar5);
    kj::Own<capnp::CallContextHook>::Own<capnp::LocalCallContext,void>
              (&local_b0,(Own<capnp::LocalCallContext> *)&forked.hub.ptr);
    func = (Type *)(ulong)uVar2;
    (*pCVar4->_vptr_ClientHook[1])(local_a0,pCVar4,pcVar1,func,&local_b0);
    kj::Own<capnp::CallContextHook>::~Own(&local_b0);
    kj::Own<capnp::LocalCallContext>::~Own((Own<capnp::LocalCallContext> *)&forked.hub.ptr);
    kj::Promise<void>::fork((Promise<void> *)local_d0);
    kj::ForkedPromise<void>::addBranch((ForkedPromise<void> *)&local_100);
    pLVar5 = kj::Own<capnp::LocalCallContext>::operator*((Own<capnp::LocalCallContext> *)local_70);
    kj::addRef<capnp::LocalCallContext>((kj *)&local_110,pLVar5);
    kj::Promise<void>::attach<kj::Own<capnp::LocalCallContext>>(&local_f0,&local_100);
    kj::mv<kj::Promise<void>>((Promise<void> *)&context.ptr);
    kj::Promise<void>::exclusiveJoin(&local_e0,&local_f0);
    kj::Promise<void>::detach<capnp::LocalRequest::send()::_lambda(kj::Exception&&)_1_>
              (&local_e0,(Type *)((long)&promise.super_PromiseBase.node.ptr + 7));
    kj::Promise<void>::~Promise(&local_e0);
    kj::Promise<void>::~Promise(&local_f0);
    kj::Own<capnp::LocalCallContext>::~Own(&local_110);
    kj::Promise<void>::~Promise((Promise<void> *)&local_100);
    kj::ForkedPromise<void>::addBranch((ForkedPromise<void> *)local_138);
    kj::
    mvCapture<capnp::LocalRequest::send()::_lambda(kj::Own<capnp::LocalCallContext>&&)_1_,kj::Own<capnp::LocalCallContext>&>
              (&local_150,(kj *)local_70,(Own<capnp::LocalCallContext> *)&local_151,func);
    kj::Promise<void>::
    then<kj::CaptureByMove<capnp::LocalRequest::send()::_lambda(kj::Own<capnp::LocalCallContext>&&)_1_,kj::Own<capnp::LocalCallContext>>,kj::_::PropagateException>
              ((Promise<void> *)(local_138 + 0x10),
               (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:215:9),_kj::Own<capnp::LocalCallContext>_>
                *)local_138,(PropagateException *)&local_150);
    kj::
    CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++:215:9),_kj::Own<capnp::LocalCallContext>_>
    ::~CaptureByMove(&local_150);
    kj::Promise<void>::~Promise((Promise<void> *)local_138);
    promise_00 = kj::mv<kj::Promise<capnp::Response<capnp::AnyPointer>>>
                           ((Promise<capnp::Response<capnp::AnyPointer>_> *)(local_138 + 0x10));
    hook = kj::mv<kj::Own<capnp::PipelineHook>>
                     ((Own<capnp::PipelineHook> *)
                      &promiseAndPipeline.promise.super_PromiseBase.node.ptr);
    AnyPointer::Pipeline::Pipeline(&local_180,hook);
    RemotePromise<capnp::AnyPointer>::RemotePromise
              ((RemotePromise<capnp::AnyPointer> *)this,promise_00,&local_180);
    AnyPointer::Pipeline::~Pipeline(&local_180);
    kj::Promise<capnp::Response<capnp::AnyPointer>_>::~Promise
              ((Promise<capnp::Response<capnp::AnyPointer>_> *)(local_138 + 0x10));
    kj::ForkedPromise<void>::~ForkedPromise((ForkedPromise<void> *)local_d0);
    ClientHook::VoidPromiseAndPipeline::~VoidPromiseAndPipeline((VoidPromiseAndPipeline *)local_a0);
    kj::Own<capnp::LocalCallContext>::~Own((Own<capnp::LocalCallContext> *)local_70);
    kj::PromiseFulfillerPair<void>::~PromiseFulfillerPair
              ((PromiseFulfillerPair<void> *)&context.ptr);
    return (ssize_t)this;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/capability.c++"
             ,0xbe,FAILED,"message.get() != nullptr","\"Already called send() on this request.\"",
             (char (*) [39])"Already called send() on this request.");
  kj::_::Debug::Fault::fatal(&local_20);
}

Assistant:

RemotePromise<AnyPointer> send() override {
    KJ_REQUIRE(message.get() != nullptr, "Already called send() on this request.");

    // For the lambda capture.
    uint64_t interfaceId = this->interfaceId;
    uint16_t methodId = this->methodId;

    auto cancelPaf = kj::newPromiseAndFulfiller<void>();

    auto context = kj::refcounted<LocalCallContext>(
        kj::mv(message), client->addRef(), kj::mv(cancelPaf.fulfiller));
    auto promiseAndPipeline = client->call(interfaceId, methodId, kj::addRef(*context));

    // We have to make sure the call is not canceled unless permitted.  We need to fork the promise
    // so that if the client drops their copy, the promise isn't necessarily canceled.
    auto forked = promiseAndPipeline.promise.fork();

    // We daemonize one branch, but only after joining it with the promise that fires if
    // cancellation is allowed.
    forked.addBranch()
        .attach(kj::addRef(*context))
        .exclusiveJoin(kj::mv(cancelPaf.promise))
        .detach([](kj::Exception&&) {});  // ignore exceptions

    // Now the other branch returns the response from the context.
    auto promise = forked.addBranch().then(kj::mvCapture(context,
        [](kj::Own<LocalCallContext>&& context) {
      context->getResults(MessageSize { 0, 0 });  // force response allocation
      return kj::mv(KJ_ASSERT_NONNULL(context->response));
    }));

    // We return the other branch.
    return RemotePromise<AnyPointer>(
        kj::mv(promise), AnyPointer::Pipeline(kj::mv(promiseAndPipeline.pipeline)));
  }